

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitSelect(I64ToI32Lowering *this,Select *curr)

{
  Builder *pBVar1;
  undefined4 index;
  Type this_00;
  bool bVar2;
  bool bVar3;
  LocalSet *any;
  Expression *pEVar4;
  Select *pSVar5;
  LocalSet *append;
  Expression *pEVar6;
  Expression *pEVar7;
  LocalSet *args;
  LocalGet *args_1;
  Block *expression;
  TempVar local_108;
  undefined1 local_e8 [8];
  TempVar highBits;
  char local_b8;
  undefined1 local_a8 [8];
  TempVar lowBits;
  undefined1 local_68 [8];
  TempVar cond;
  
  bVar2 = handleUnreachable(this,(Expression *)curr);
  if (!bVar2) {
    bVar2 = hasOutParam(this,curr->ifTrue);
    bVar3 = hasOutParam(this,curr->ifFalse);
    if (bVar2) {
      if (!bVar3) {
        __assert_fail("hasOutParam(curr->ifFalse)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x61c,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
      }
      getTemp((TempVar *)local_e8,this,(Type)0x2);
      getTemp((TempVar *)local_a8,this,(Type)0x2);
      getTemp((TempVar *)local_68,this,(Type)0x2);
      if ((char)cond.pass != '\x01') {
        lowBits.ty.id =
             (uintptr_t)
             (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        any = Builder::makeLocalSet((Builder *)lowBits.ty.id,local_68._0_4_,curr->condition);
        index = local_a8._0_4_;
        if (((char)lowBits.pass != '\x01') && ((char)cond.pass != '\x01')) {
          pBVar1 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          cond.ty.id._0_4_ = local_68._0_4_;
          pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
          pEVar4->_id = LocalGetId;
          *(undefined4 *)(pEVar4 + 1) = cond.ty.id._0_4_;
          (pEVar4->type).id = 2;
          cond.ty.id = (uintptr_t)curr->ifTrue;
          pEVar6 = curr->ifFalse;
          pSVar5 = (Select *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
          (pSVar5->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id =
               SelectId;
          (pSVar5->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id = 0;
          pSVar5->condition = pEVar4;
          pSVar5->ifTrue = (Expression *)cond.ty.id;
          pSVar5->ifFalse = pEVar6;
          Select::finalize(pSVar5);
          append = Builder::makeLocalSet(pBVar1,index,(Expression *)pSVar5);
          if (((char)highBits.pass != '\x01') && ((char)cond.pass != '\x01')) {
            cond.ty.id = (uintptr_t)
                         (this->builder)._M_t.
                         super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                         .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            pEVar6 = (Expression *)
                     MixedArena::allocSpace(&((Builder *)cond.ty.id)->wasm->allocator,0x18,8);
            pEVar6->_id = LocalGetId;
            *(undefined4 *)(pEVar6 + 1) = local_68._0_4_;
            (pEVar6->type).id = 2;
            pBVar1 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            fetchOutParam((TempVar *)&highBits.ty,this,curr->ifTrue);
            if (local_b8 != '\x01') {
              pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
              pEVar4->_id = LocalGetId;
              *(undefined4 *)(pEVar4 + 1) = (undefined4)highBits.ty.id;
              (pEVar4->type).id = 2;
              pBVar1 = (this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
              fetchOutParam(&local_108,this,curr->ifFalse);
              if (local_108.moved != true) {
                pEVar7 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
                this_00 = cond.ty;
                pEVar7->_id = LocalGetId;
                *(Index *)(pEVar7 + 1) = local_108.idx;
                (pEVar7->type).id = 2;
                pSVar5 = (Select *)
                         MixedArena::allocSpace((MixedArena *)(*(long *)cond.ty.id + 0x200),0x28,8);
                (pSVar5->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id =
                     SelectId;
                (pSVar5->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.
                id = 0;
                pSVar5->condition = pEVar6;
                pSVar5->ifTrue = pEVar4;
                pSVar5->ifFalse = pEVar7;
                Select::finalize(pSVar5);
                args = Builder::makeLocalSet
                                 ((Builder *)this_00.id,local_e8._0_4_,(Expression *)pSVar5);
                if ((char)lowBits.pass != '\x01') {
                  args_1 = (LocalGet *)
                           MixedArena::allocSpace
                                     (&((this->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)
                                       ->wasm->allocator,0x18,8);
                  (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id =
                       LocalGetId;
                  args_1->index = local_a8._0_4_;
                  (args_1->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.
                  id = 2;
                  expression = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                                         ((Builder *)lowBits.ty.id,(Expression *)any,
                                          (Expression *)append,args,args_1);
                  TempVar::~TempVar(&local_108);
                  TempVar::~TempVar((TempVar *)&highBits.ty);
                  highBits.ty.id = (uintptr_t)expression;
                  std::
                  _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                            ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)&this->highBitVars,&highBits.ty,local_e8);
                  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::
                  replaceCurrent(&(this->
                                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                  .
                                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 ,(Expression *)expression);
                  TempVar::~TempVar((TempVar *)local_68);
                  TempVar::~TempVar((TempVar *)local_a8);
                  TempVar::~TempVar((TempVar *)local_e8);
                  return;
                }
              }
            }
          }
        }
      }
      __assert_fail("!moved",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
    }
    if (bVar3) {
      __assert_fail("!hasOutParam(curr->ifFalse)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x619,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
    }
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!hasOutParam(curr->ifTrue)) {
      assert(!hasOutParam(curr->ifFalse));
      return;
    }
    assert(hasOutParam(curr->ifFalse));
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();
    TempVar cond = getTemp();
    Block* result = builder->blockify(
      builder->makeLocalSet(cond, curr->condition),
      builder->makeLocalSet(
        lowBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32), curr->ifTrue, curr->ifFalse)),
      builder->makeLocalSet(
        highBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifTrue), Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifFalse), Type::i32))),
      builder->makeLocalGet(lowBits, Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }